

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::MhsWriter::~MhsWriter(MhsWriter *this)

{
  ADIOS *this_00;
  int __val;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsWriter_00825a98;
  for (__val = 0; __val < this->m_Tiers; __val = __val + 1) {
    this_00 = ((this->super_Engine).m_IO)->m_ADIOS;
    std::__cxx11::to_string(&local_70,__val);
    std::operator+(&local_50,"SubIO",&local_70);
    ADIOS::RemoveIO(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  (this->super_Engine).m_IsOpen = false;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Operator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Operator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_TransportMap)._M_h);
  std::_Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::~_Vector_base
            (&(this->m_SubEngines).
              super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>);
  std::_Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::~_Vector_base
            (&(this->m_SubIOs).
              super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>);
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

MhsWriter::~MhsWriter()
{
    for (int i = 0; i < m_Tiers; ++i)
    {
        m_IO.m_ADIOS.RemoveIO("SubIO" + std::to_string(i));
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}